

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O3

bool __thiscall cmParsePHPCoverage::ReadPHPData(cmParsePHPCoverage *this,char *file)

{
  cmCTest *this_00;
  cmParsePHPCoverage *this_01;
  char c;
  int size;
  ostringstream cmCTestLog_msg;
  ifstream in;
  long *local_3d8;
  long local_3c8 [2];
  int local_3b4;
  undefined1 local_3b0 [376];
  cmParsePHPCoverage local_238 [2];
  byte abStack_218 [488];
  
  this_01 = local_238;
  std::ifstream::ifstream(this_01,file,_S_in);
  if ((abStack_218
       [local_238[0].Coverage[-1].TotalCoverage._M_t._M_impl.super__Rb_tree_header._M_node_count] &
      5) == 0) {
    local_3b4 = 0;
    ReadArraySize(this_01,(istream *)local_238,&local_3b4);
    std::istream::get((char *)local_238);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"failed to read open array\n",0x1a);
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0xb7,(char *)local_3d8,false);
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8,local_3c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
  }
  std::ifstream::~ifstream(local_238);
  return false;
}

Assistant:

bool cmParsePHPCoverage::ReadPHPData(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    return false;
  }
  int size = 0;
  this->ReadArraySize(in, size);
  char c = 0;
  in.get(c);
  if (c != '{') {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read open array\n");
    return false;
  }
  for (int i = 0; i < size; i++) {
    if (!this->ReadFileInformation(in)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Failed to read file #" << i << "\n");
      return false;
    }
    in.get(c);
    if (c != '}') {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "failed to read close array\n");
      return false;
    }
  }
  return true;
}